

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
          (string *__return_storage_ptr__,void *this,MetaData *metadata)

{
  long lVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  Values values;
  string key;
  ostringstream stream;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar1 = Typelib::MetaData::get_abi_cxx11_();
  for (p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x18); p_Var4 != (_Rb_tree_node_base *)(lVar1 + 8);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::string::string(local_1c8,(string *)(p_Var4 + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_1f8,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(p_Var4 + 2));
    p_Var3 = local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_1f8._M_impl.super__Rb_tree_header._M_node_count == 0) {
      poVar2 = std::operator<<((ostream *)local_1a8,"<metadata key=\"");
      poVar2 = std::operator<<(poVar2,local_1c8);
      std::operator<<(poVar2,"\" />");
    }
    else {
      for (; (_Rb_tree_header *)p_Var3 != &local_1f8._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = std::operator<<((ostream *)local_1a8,"<metadata key=\"");
        poVar2 = std::operator<<(poVar2,local_1c8);
        poVar2 = std::operator<<(poVar2,"\"><![CDATA[");
        poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
        std::operator<<(poVar2,"]]></metadata>\n");
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1f8);
    std::__cxx11::string::~string(local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TlbExportVisitor::emitMetaData(MetaData const& metadata) const
    {
        std::ostringstream stream;
        MetaData::Map const& map = metadata.get();
        for (MetaData::Map::const_iterator it = map.begin(); it != map.end(); ++it)
        {
            std::string key = it->first;
            MetaData::Values values = it->second;
            if (values.empty())
            {
                stream << "<metadata key=\"" << key << "\" />";
            }
            else
            {
                for (MetaData::Values::const_iterator it_value = values.begin(); it_value != values.end(); ++it_value)
                    stream << "<metadata key=\"" << key << "\"><![CDATA[" << *it_value << "]]></metadata>\n";
            }
        }
        return stream.str();
    }